

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

ExprList * exprListAppendList(Parse *pParse,ExprList *pList,ExprList *pAppend)

{
  Expr *pExpr;
  int local_34;
  Expr *pDup;
  int nInit;
  int i;
  ExprList *pAppend_local;
  ExprList *pList_local;
  Parse *pParse_local;
  
  pAppend_local = pList;
  if (pAppend != (ExprList *)0x0) {
    if (pList == (ExprList *)0x0) {
      local_34 = 0;
    }
    else {
      local_34 = pList->nExpr;
    }
    for (pDup._4_4_ = 0; pDup._4_4_ < pAppend->nExpr; pDup._4_4_ = pDup._4_4_ + 1) {
      pExpr = sqlite3ExprDup(pParse->db,pAppend->a[pDup._4_4_].pExpr,0);
      pAppend_local = sqlite3ExprListAppend(pParse,pAppend_local,pExpr);
      if (pAppend_local != (ExprList *)0x0) {
        pAppend_local->a[local_34 + pDup._4_4_].sortOrder = pAppend->a[pDup._4_4_].sortOrder;
      }
    }
  }
  return pAppend_local;
}

Assistant:

static ExprList *exprListAppendList(
  Parse *pParse,          /* Parsing context */
  ExprList *pList,        /* List to which to append. Might be NULL */
  ExprList *pAppend       /* List of values to append. Might be NULL */
){
  if( pAppend ){
    int i;
    int nInit = pList ? pList->nExpr : 0;
    for(i=0; i<pAppend->nExpr; i++){
      Expr *pDup = sqlite3ExprDup(pParse->db, pAppend->a[i].pExpr, 0);
      pList = sqlite3ExprListAppend(pParse, pList, pDup);
      if( pList ) pList->a[nInit+i].sortOrder = pAppend->a[i].sortOrder;
    }
  }
  return pList;
}